

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

v128 compute_directions(v128 *lines,int32_t *tmp_cost1)

{
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  longlong in_R8;
  longlong in_R9;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  v128 alVar11;
  v128 partialb;
  v128 partialb_00;
  v128 partialb_01;
  v128 x1;
  v128 const1;
  v128 const1_00;
  v128 const1_01;
  v128 x2;
  v128 partiala;
  v128 partiala_00;
  v128 partiala_01;
  v128 x0;
  v128 tmp;
  v128 partial6;
  v128 partial7b;
  v128 partial7a;
  v128 partial5b;
  v128 partial5a;
  v128 partial4b;
  v128 partial4a;
  undefined8 local_a48;
  undefined8 uStack_a40;
  longlong lVar1;
  
  auVar2 = vpslldq_avx(*in_RDI,0xe);
  auVar3 = vpsrldq_avx(*in_RDI,2);
  auVar4 = vpslldq_avx(in_RDI[1],0xc);
  auVar2 = vpaddw_avx(auVar2,auVar4);
  auVar4 = vpsrldq_avx(in_RDI[1],4);
  auVar3 = vpaddw_avx(auVar3,auVar4);
  auVar4 = vpaddw_avx(*in_RDI,in_RDI[1]);
  auVar5 = vpslldq_avx(auVar4,10);
  auVar6 = vpsrldq_avx(auVar4,6);
  auVar7 = vpslldq_avx(auVar4,4);
  auVar8 = vpsrldq_avx(auVar4,0xc);
  auVar9 = vpslldq_avx(in_RDI[2],10);
  auVar2 = vpaddw_avx(auVar2,auVar9);
  auVar9 = vpsrldq_avx(in_RDI[2],6);
  auVar3 = vpaddw_avx(auVar3,auVar9);
  auVar9 = vpslldq_avx(in_RDI[3],8);
  auVar2 = vpaddw_avx(auVar2,auVar9);
  auVar9 = vpsrldq_avx(in_RDI[3],8);
  auVar3 = vpaddw_avx(auVar3,auVar9);
  auVar9 = vpaddw_avx(in_RDI[2],in_RDI[3]);
  auVar10 = vpslldq_avx(auVar9,8);
  auVar5 = vpaddw_avx(auVar5,auVar10);
  auVar10 = vpsrldq_avx(auVar9,8);
  auVar6 = vpaddw_avx(auVar6,auVar10);
  auVar10 = vpslldq_avx(auVar9,6);
  auVar7 = vpaddw_avx(auVar7,auVar10);
  auVar10 = vpsrldq_avx(auVar9,10);
  auVar8 = vpaddw_avx(auVar8,auVar10);
  auVar4 = vpaddw_avx(auVar4,auVar9);
  auVar9 = vpslldq_avx(in_RDI[4],6);
  auVar2 = vpaddw_avx(auVar2,auVar9);
  auVar9 = vpsrldq_avx(in_RDI[4],10);
  auVar3 = vpaddw_avx(auVar3,auVar9);
  auVar9 = vpslldq_avx(in_RDI[5],4);
  auVar2 = vpaddw_avx(auVar2,auVar9);
  auVar9 = vpsrldq_avx(in_RDI[5],0xc);
  auVar3 = vpaddw_avx(auVar3,auVar9);
  auVar9 = vpaddw_avx(in_RDI[4],in_RDI[5]);
  auVar10 = vpslldq_avx(auVar9,6);
  auVar5 = vpaddw_avx(auVar5,auVar10);
  auVar10 = vpsrldq_avx(auVar9,10);
  auVar6 = vpaddw_avx(auVar6,auVar10);
  auVar10 = vpslldq_avx(auVar9,8);
  auVar7 = vpaddw_avx(auVar7,auVar10);
  auVar10 = vpsrldq_avx(auVar9,8);
  auVar8 = vpaddw_avx(auVar8,auVar10);
  auVar4 = vpaddw_avx(auVar4,auVar9);
  auVar9 = vpslldq_avx(in_RDI[6],2);
  auVar2 = vpaddw_avx(auVar2,auVar9);
  auVar9 = vpsrldq_avx(in_RDI[6],0xe);
  vpaddw_avx(auVar3,auVar9);
  auVar2 = vpaddw_avx(auVar2,in_RDI[7]);
  alVar11 = (v128)vpaddw_avx(in_RDI[6],in_RDI[7]);
  auVar3 = vpslldq_avx((undefined1  [16])alVar11,4);
  vpaddw_avx(auVar5,auVar3);
  auVar3 = vpsrldq_avx((undefined1  [16])alVar11,0xc);
  vpaddw_avx(auVar6,auVar3);
  auVar3 = vpslldq_avx((undefined1  [16])alVar11,10);
  vpaddw_avx(auVar7,auVar3);
  auVar3 = vpsrldq_avx((undefined1  [16])alVar11,6);
  vpaddw_avx(auVar8,auVar3);
  auVar3 = vpaddw_avx(auVar4,(undefined1  [16])alVar11);
  local_a48 = auVar2._0_8_;
  uStack_a40 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x348),0x1a4,1);
  auVar2 = vpinsrd_avx(auVar2,0x118,2);
  vpinsrd_avx(auVar2,0xd2,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xa8),0x8c,1);
  auVar2 = vpinsrd_avx(auVar2,0x78,2);
  vpinsrd_avx(auVar2,0x69,3);
  partialb[1]._0_4_ = 0x78;
  partialb[0] = 0x8c;
  partialb[1]._4_4_ = 0;
  const1[1] = in_R9;
  const1[0] = in_R8;
  partiala[1]._0_4_ = 0x69;
  partiala[0] = (longlong)in_RDI;
  partiala[1]._4_4_ = 0;
  fold_mul_and_sum(partiala,partialb,const1,alVar11);
  auVar2 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar2 = vpinsrd_avx(auVar2,0x1a4,2);
  vpinsrd_avx(auVar2,0xd2,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x8c),0x69,1);
  auVar2 = vpinsrd_avx(auVar2,0x69,2);
  vpinsrd_avx(auVar2,0x69,3);
  partialb_00[1]._0_4_ = 0x69;
  partialb_00[0] = 0x69;
  partialb_00[1]._4_4_ = 0;
  const1_00[1] = in_R9;
  const1_00[0] = in_R8;
  partiala_00[1]._0_4_ = 0x69;
  partiala_00[0] = (longlong)in_RDI;
  partiala_00[1]._4_4_ = 0;
  fold_mul_and_sum(partiala_00,partialb_00,const1_00,alVar11);
  auVar2 = vpinsrd_avx(ZEXT416(0),0,1);
  auVar2 = vpinsrd_avx(auVar2,0x1a4,2);
  vpinsrd_avx(auVar2,0xd2,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x8c),0x69,1);
  auVar2 = vpinsrd_avx(auVar2,0x69,2);
  vpinsrd_avx(auVar2,0x69,3);
  partialb_01[1]._0_4_ = 0x69;
  partialb_01[0] = 0x69;
  partialb_01[1]._4_4_ = 0;
  const1_01[1] = in_R9;
  const1_01[0] = in_R8;
  partiala_01[1]._0_4_ = 0x69;
  partiala_01[0] = (longlong)in_RDI;
  partiala_01[1]._4_4_ = 0;
  lVar1 = 0x69;
  fold_mul_and_sum(partiala_01,partialb_01,const1_01,alVar11);
  auVar3 = vpmaddwd_avx(auVar3,auVar3);
  auVar2 = vpinsrd_avx(ZEXT416(0x69),0x69,1);
  auVar2 = vpinsrd_avx(auVar2,0x69,2);
  auVar2 = vpinsrd_avx(auVar2,0x69,3);
  vpmulld_avx(auVar3,auVar2);
  x1[1]._0_4_ = 0x69;
  x1[0] = 0x69;
  x1[1]._4_4_ = 0;
  x2[1] = in_R9;
  x2[0] = in_R8;
  x0[1] = lVar1;
  x0[0] = (longlong)in_RDI;
  alVar11 = hsum4(x0,x1,x2,alVar11);
  *in_RSI = local_a48;
  in_RSI[1] = uStack_a40;
  alVar11[0] = (longlong)in_RSI;
  return alVar11;
}

Assistant:

static inline v128 compute_directions(v128 lines[8], int32_t tmp_cost1[4]) {
  v128 partial4a, partial4b, partial5a, partial5b, partial7a, partial7b;
  v128 partial6;
  v128 tmp;
  /* Partial sums for lines 0 and 1. */
  partial4a = v128_shl_n_byte(lines[0], 14);
  partial4b = v128_shr_n_byte(lines[0], 2);
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[1], 12));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[1], 4));
  tmp = v128_add_16(lines[0], lines[1]);
  partial5a = v128_shl_n_byte(tmp, 10);
  partial5b = v128_shr_n_byte(tmp, 6);
  partial7a = v128_shl_n_byte(tmp, 4);
  partial7b = v128_shr_n_byte(tmp, 12);
  partial6 = tmp;

  /* Partial sums for lines 2 and 3. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[2], 10));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[2], 6));
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[3], 8));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[3], 8));
  tmp = v128_add_16(lines[2], lines[3]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 8));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 8));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 6));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 10));
  partial6 = v128_add_16(partial6, tmp);

  /* Partial sums for lines 4 and 5. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[4], 6));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[4], 10));
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[5], 4));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[5], 12));
  tmp = v128_add_16(lines[4], lines[5]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 6));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 10));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 8));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 8));
  partial6 = v128_add_16(partial6, tmp);

  /* Partial sums for lines 6 and 7. */
  partial4a = v128_add_16(partial4a, v128_shl_n_byte(lines[6], 2));
  partial4b = v128_add_16(partial4b, v128_shr_n_byte(lines[6], 14));
  partial4a = v128_add_16(partial4a, lines[7]);
  tmp = v128_add_16(lines[6], lines[7]);
  partial5a = v128_add_16(partial5a, v128_shl_n_byte(tmp, 4));
  partial5b = v128_add_16(partial5b, v128_shr_n_byte(tmp, 12));
  partial7a = v128_add_16(partial7a, v128_shl_n_byte(tmp, 10));
  partial7b = v128_add_16(partial7b, v128_shr_n_byte(tmp, 6));
  partial6 = v128_add_16(partial6, tmp);

  /* Compute costs in terms of partial sums. */
  partial4a =
      fold_mul_and_sum(partial4a, partial4b, v128_from_32(210, 280, 420, 840),
                       v128_from_32(105, 120, 140, 168));
  partial7a =
      fold_mul_and_sum(partial7a, partial7b, v128_from_32(210, 420, 0, 0),
                       v128_from_32(105, 105, 105, 140));
  partial5a =
      fold_mul_and_sum(partial5a, partial5b, v128_from_32(210, 420, 0, 0),
                       v128_from_32(105, 105, 105, 140));
  partial6 = v128_madd_s16(partial6, partial6);
  partial6 = v128_mullo_s32(partial6, v128_dup_32(105));

  partial4a = hsum4(partial4a, partial5a, partial6, partial7a);
  v128_store_unaligned(tmp_cost1, partial4a);
  return partial4a;
}